

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::NestedDescriptorTest_EnumName_Test::TestBody
          (NestedDescriptorTest_EnumName_Test *this)

{
  ushort *puVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertHelper AStack_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  internal local_20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  puVar1 = (ushort *)(((this->super_NestedDescriptorTest).baz_)->all_names_).payload_;
  local_30._M_len = (size_t)*puVar1;
  local_30._M_str = (char *)((long)puVar1 + ~local_30._M_len);
  testing::internal::CmpHelperEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
            (local_20,"\"Baz\"","baz_->name()",(char (*) [4])0x10c950e,&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x87d,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_30._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_len + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  puVar1 = (ushort *)(((this->super_NestedDescriptorTest).moo_)->all_names_).payload_;
  local_30._M_len = (size_t)*puVar1;
  local_30._M_str = (char *)((long)puVar1 + ~local_30._M_len);
  testing::internal::CmpHelperEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
            (local_20,"\"Moo\"","moo_->name()",(char (*) [4])0x10c9a95,&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x87e,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_30._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_len + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  puVar1 = (ushort *)(((this->super_NestedDescriptorTest).moo2_)->all_names_).payload_;
  local_30._M_len = (size_t)*puVar1;
  local_30._M_str = (char *)((long)puVar1 + ~local_30._M_len);
  testing::internal::CmpHelperEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
            (local_20,"\"Moo\"","moo2_->name()",(char (*) [4])0x10c9a95,&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x87f,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_30._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_len + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  puVar1 = (ushort *)(((this->super_NestedDescriptorTest).mooo2_)->all_names_).payload_;
  local_30._M_len = (size_t)*puVar1;
  local_30._M_str = (char *)((long)puVar1 + ~local_30._M_len);
  testing::internal::CmpHelperEQ<char[5],std::basic_string_view<char,std::char_traits<char>>>
            (local_20,"\"Mooo\"","mooo2_->name()",(char (*) [5])0x10c9ad4,&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x880,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_30._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_len + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  local_30._M_str = (((this->super_NestedDescriptorTest).baz_)->all_names_).payload_;
  local_30._M_len = (size_t)*(ushort *)(local_30._M_str + 2);
  local_30._M_str = local_30._M_str + ~local_30._M_len;
  testing::internal::CmpHelperEQ<char[16],std::basic_string_view<char,std::char_traits<char>>>
            (local_20,"\"TestMessage.Baz\"","baz_->full_name()",(char (*) [16])"TestMessage.Baz",
             &local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x882,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_30._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_len + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  local_30._M_str = (((this->super_NestedDescriptorTest).moo_)->all_names_).payload_;
  local_30._M_len = (size_t)*(ushort *)(local_30._M_str + 2);
  local_30._M_str = local_30._M_str + ~local_30._M_len;
  testing::internal::CmpHelperEQ<char[16],std::basic_string_view<char,std::char_traits<char>>>
            (local_20,"\"TestMessage.Moo\"","moo_->full_name()",(char (*) [16])"TestMessage.Moo",
             &local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x883,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_30._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_len + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  local_30._M_str = (((this->super_NestedDescriptorTest).moo2_)->all_names_).payload_;
  local_30._M_len = (size_t)*(ushort *)(local_30._M_str + 2);
  local_30._M_str = local_30._M_str + ~local_30._M_len;
  testing::internal::CmpHelperEQ<char[30],std::basic_string_view<char,std::char_traits<char>>>
            (local_20,"\"corge.grault.TestMessage2.Moo\"","moo2_->full_name()",
             (char (*) [30])"corge.grault.TestMessage2.Moo",&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x884,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_30._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_len + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  local_30._M_str = (((this->super_NestedDescriptorTest).mooo2_)->all_names_).payload_;
  local_30._M_len = (size_t)*(ushort *)(local_30._M_str + 2);
  local_30._M_str = local_30._M_str + ~local_30._M_len;
  testing::internal::CmpHelperEQ<char[31],std::basic_string_view<char,std::char_traits<char>>>
            (local_20,"\"corge.grault.TestMessage2.Mooo\"","mooo2_->full_name()",
             (char (*) [31])"corge.grault.TestMessage2.Mooo",&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x885,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if ((long *)local_30._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_len + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  return;
}

Assistant:

TEST_F(NestedDescriptorTest, EnumName) {
  EXPECT_EQ("Baz", baz_->name());
  EXPECT_EQ("Moo", moo_->name());
  EXPECT_EQ("Moo", moo2_->name());
  EXPECT_EQ("Mooo", mooo2_->name());

  EXPECT_EQ("TestMessage.Baz", baz_->full_name());
  EXPECT_EQ("TestMessage.Moo", moo_->full_name());
  EXPECT_EQ("corge.grault.TestMessage2.Moo", moo2_->full_name());
  EXPECT_EQ("corge.grault.TestMessage2.Mooo", mooo2_->full_name());
}